

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

Material * __thiscall btSoftBody::appendMaterial(btSoftBody *this)

{
  Material *pMVar1;
  btScalar bVar2;
  int iVar3;
  btAlignedObjectArray<btSoftBody::Material_*> *this_00;
  Material **ppMVar4;
  Material **in_RDI;
  Material *pm;
  int in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (btAlignedObjectArray<btSoftBody::Material_*> *)
            btAlignedAllocInternal(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  memset(this_00,0,0x18);
  Material::Material((Material *)0x267c50);
  iVar3 = btAlignedObjectArray<btSoftBody::Material_*>::size
                    ((btAlignedObjectArray<btSoftBody::Material_*> *)(in_RDI + 0x8e));
  if (iVar3 < 1) {
    ZeroInitialize<btSoftBody::Material>((Material *)0x267cad);
  }
  else {
    ppMVar4 = btAlignedObjectArray<btSoftBody::Material_*>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Material_*> *)(in_RDI + 0x8e),0);
    pMVar1 = *ppMVar4;
    *(void **)this_00 = (pMVar1->super_Element).m_tag;
    bVar2 = pMVar1->m_kAST;
    this_00->m_capacity = (int)pMVar1->m_kLST;
    *(btScalar *)&this_00->field_0xc = bVar2;
    this_00->m_data = *(Material ***)&pMVar1->m_kVST;
  }
  btAlignedObjectArray<btSoftBody::Material_*>::push_back(this_00,in_RDI);
  return (Material *)this_00;
}

Assistant:

btSoftBody::Material*		btSoftBody::appendMaterial()
{
	Material*	pm=new(btAlignedAlloc(sizeof(Material),16)) Material();
	if(m_materials.size()>0)
		*pm=*m_materials[0];
	else
		ZeroInitialize(*pm);
	m_materials.push_back(pm);
	return(pm);
}